

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ecdsa_adaptor.cpp
# Opt level: O2

void __thiscall ECDSAAdaptor_ExtractSecret_Test::TestBody(ECDSAAdaptor_ExtractSecret_Test *this)

{
  char *message;
  AssertionResult gtest_ar;
  string local_98;
  string local_78;
  Privkey sec;
  ByteData raw_sig;
  SigHashType sig_hash;
  
  cfd::core::SigHashType::SigHashType(&sig_hash);
  cfd::core::CryptoUtil::ConvertSignatureFromDer(&raw_sig,&sig_der,&sig_hash);
  cfd::core::AdaptorUtil::ExtractSecret(&sec,&adaptor_sig2,&raw_sig,&adaptor);
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_78,&secret);
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_98,&sec);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"secret.GetHex()","sec.GetHex()",&local_78,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_ecdsa_adaptor.cpp"
               ,0x47,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sec);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&raw_sig);
  return;
}

Assistant:

TEST(ECDSAAdaptor, ExtractSecret) {
  SigHashType sig_hash;
  auto raw_sig = CryptoUtil::ConvertSignatureFromDer(sig_der, &sig_hash);

  auto sec = AdaptorUtil::ExtractSecret(adaptor_sig2, raw_sig, adaptor);

  EXPECT_EQ(secret.GetHex(), sec.GetHex());
}